

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O0

void re2::Parse3NFA(int iters,char *regexp,StringPiece *text)

{
  StringPiece *text_00;
  bool bVar1;
  Prog *this;
  ostream *poVar2;
  StringPiece *local_550;
  LogMessage local_528;
  StringPiece local_3a8;
  undefined1 local_398 [8];
  StringPiece sp [4];
  Prog *prog;
  LogMessage local_1c0;
  StringPiece local_40;
  Regexp *local_30;
  Regexp *re;
  StringPiece *pSStack_20;
  int i;
  StringPiece *text_local;
  char *regexp_local;
  int iters_local;
  
  pSStack_20 = text;
  text_local = (StringPiece *)regexp;
  regexp_local._4_4_ = iters;
  for (re._4_4_ = 0; re._4_4_ < regexp_local._4_4_; re._4_4_ = re._4_4_ + 1) {
    StringPiece::StringPiece(&local_40,(char *)text_local);
    local_30 = Regexp::Parse(&local_40,LikePerl,(RegexpStatus *)0x0);
    if (local_30 == (Regexp *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x41c);
      poVar2 = LogMessage::stream(&local_1c0);
      std::operator<<(poVar2,"Check failed: re");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1c0);
    }
    this = Regexp::CompileToProg(local_30,0);
    if (this == (Prog *)0x0) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp[3].length_,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x41e);
      poVar2 = LogMessage::stream((LogMessage *)&sp[3].length_);
      std::operator<<(poVar2,"Check failed: prog");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp[3].length_);
    }
    local_550 = (StringPiece *)local_398;
    do {
      StringPiece::StringPiece(local_550);
      text_00 = pSStack_20;
      local_550 = local_550 + 1;
    } while (local_550 != (StringPiece *)&sp[3].length_);
    StringPiece::StringPiece(&local_3a8,(char *)0x0);
    bVar1 = Prog::SearchNFA(this,text_00,&local_3a8,kAnchored,kFullMatch,(StringPiece *)local_398,4)
    ;
    if (!bVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_528,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                 ,0x420);
      poVar2 = LogMessage::stream(&local_528);
      std::operator<<(poVar2,
                      "Check failed: prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4)"
                     );
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_528);
    }
    if (this != (Prog *)0x0) {
      Prog::~Prog(this);
      operator_delete(this);
    }
    Regexp::Decref(local_30);
  }
  return;
}

Assistant:

void Parse3NFA(int iters, const char* regexp, const StringPiece& text) {
  for (int i = 0; i < iters; i++) {
    Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
    CHECK(re);
    Prog* prog = re->CompileToProg(0);
    CHECK(prog);
    StringPiece sp[4];  // 4 because sp[0] is whole match.
    CHECK(prog->SearchNFA(text, NULL, Prog::kAnchored, Prog::kFullMatch, sp, 4));
    delete prog;
    re->Decref();
  }
}